

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strncasecmp(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 SLen;
  sxi32 iValue;
  char *zLeft;
  char *zRight;
  
  if (nArg < 3) {
    jx9Builtin_strcasecmp(pCtx,nArg,apArg);
  }
  else {
    SLen = jx9_value_to_int(apArg[2]);
    if ((int)SLen < 0) {
      iValue = -1;
    }
    else {
      zLeft = jx9_value_to_string(*apArg,(int *)0x0);
      zRight = jx9_value_to_string(apArg[1],(int *)0x0);
      iValue = SyStrnicmp(zLeft,zRight,SLen);
    }
    jx9_result_int(pCtx,iValue);
  }
  return 0;
}

Assistant:

static int jx9Builtin_strncasecmp(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *z1, *z2;
	int res;
	int n;
	if( nArg < 3 ){
		/* Perform a standard comparison */
		return jx9Builtin_strcasecmp(pCtx, nArg, apArg);
	}
	/* Desired comparison length */
	n  = jx9_value_to_int(apArg[2]);
	if( n < 0 ){
		/* Invalid length */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Perform the comparison */
	z1 = jx9_value_to_string(apArg[0], 0);
	z2 = jx9_value_to_string(apArg[1], 0);
	res = SyStrnicmp(z1, z2, (sxu32)n);
	/* Comparison result */
	jx9_result_int(pCtx, res);
	return JX9_OK;
}